

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

char * xmlGetEncodingAlias(char *alias)

{
  int iVar1;
  char local_88 [8];
  char upper [100];
  int local_1c;
  int i;
  char *alias_local;
  
  if ((alias != (char *)0x0) && (xmlCharEncodingAliases != (xmlCharEncodingAliasPtr)0x0)) {
    for (local_1c = 0; local_1c < 99; local_1c = local_1c + 1) {
      iVar1 = toupper((int)alias[local_1c]);
      local_88[local_1c] = (char)iVar1;
      if (local_88[local_1c] == '\0') break;
    }
    local_88[local_1c] = '\0';
    for (local_1c = 0; local_1c < xmlCharEncodingAliasesNb; local_1c = local_1c + 1) {
      iVar1 = strcmp(xmlCharEncodingAliases[local_1c].alias,local_88);
      if (iVar1 == 0) {
        return xmlCharEncodingAliases[local_1c].name;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
xmlGetEncodingAlias(const char *alias) {
    int i;
    char upper[100];

    if (alias == NULL)
	return(NULL);

    if (xmlCharEncodingAliases == NULL)
	return(NULL);

    for (i = 0;i < 99;i++) {
        upper[i] = toupper(alias[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    /*
     * Walk down the list looking for a definition of the alias
     */
    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (!strcmp(xmlCharEncodingAliases[i].alias, upper)) {
	    return(xmlCharEncodingAliases[i].name);
	}
    }
    return(NULL);
}